

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

void __thiscall Indexing::CodeTree::ILStruct::ensureFreshness(ILStruct *this,uint globalTimestamp)

{
  uint globalTimestamp_local;
  ILStruct *this_local;
  
  if (this->timestamp != globalTimestamp) {
    this->timestamp = globalTimestamp;
    this->visited = false;
    this->finished = false;
    this->noNonOppositeMatches = false;
    this->matchCnt = 0;
  }
  return;
}

Assistant:

void CodeTree::ILStruct::ensureFreshness(unsigned globalTimestamp)
{
  if(timestamp!=globalTimestamp) {
    timestamp=globalTimestamp;
    visited=false;
    finished=false;
    noNonOppositeMatches=false;
    matchCnt=0;
  }
}